

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.h
# Opt level: O1

int double_conversion::Bignum::Compare(Bignum *a,Bignum *b)

{
  long lVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  Bignum *pBVar9;
  long lVar10;
  Chunk CVar11;
  
  sVar2 = a->exponent_;
  lVar1 = (long)sVar2 + (long)a->used_bigits_;
  lVar8 = (long)b->exponent_;
  lVar7 = b->used_bigits_ + lVar8;
  iVar3 = -1;
  iVar6 = (int)lVar7;
  if ((iVar6 <= (int)lVar1) && (iVar3 = 1, (int)lVar1 <= iVar6)) {
    pBVar9 = (Bignum *)(a->bigits_buffer_ + (long)a->used_bigits_ + -1);
    if (b->exponent_ < sVar2) {
      a = b;
    }
    uVar4 = lVar8 * 4;
    lVar10 = lVar1;
    do {
      if (lVar10 <= a->exponent_) {
        return 0;
      }
      uVar5 = 0;
      CVar11 = 0;
      if (sVar2 < lVar10 && lVar10 <= lVar1) {
        CVar11._0_2_ = pBVar9->used_bigits_;
        CVar11._2_2_ = pBVar9->exponent_;
      }
      if (lVar8 < lVar10 && lVar10 <= lVar7) {
        uVar5 = *(uint *)((long)b + lVar10 * 4 + lVar8 * -4);
      }
      pBVar9 = (Bignum *)((long)(pBVar9 + 0xffffffffffffffff) + 0x200);
      lVar10 = lVar10 + -1;
      uVar4 = uVar4 & 0xffffffff;
      if (uVar5 < CVar11) {
        uVar4 = 1;
      }
      if (CVar11 < uVar5) {
        uVar4 = 0xffffffff;
      }
      iVar3 = (int)uVar4;
    } while (CVar11 == uVar5);
  }
  return iVar3;
}

Assistant:

int BigitLength() const { return used_bigits_ + exponent_; }